

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSceneCombiner.cpp
# Opt level: O3

void __thiscall
utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test::TestBody
          (utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  AssertHelper local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::SceneCombiner::CopyScene((aiScene **)0x0,(aiScene *)0x0,true);
    }
  }
  else {
    testing::Message::Message((Message *)&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSceneCombiner.cpp"
               ,0x4d,
               "Expected: SceneCombiner::CopyScene( nullptr, nullptr ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_10);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::SceneCombiner::CopySceneFlat((aiScene **)0x0,(aiScene *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSceneCombiner.cpp"
               ,0x4e,
               "Expected: SceneCombiner::CopySceneFlat( nullptr, nullptr ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_10);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
    }
  }
  return;
}

Assistant:

TEST_F( utSceneCombiner, CopySceneWithNullptr_AI_NO_EXCEPTion ) {
    EXPECT_NO_THROW( SceneCombiner::CopyScene( nullptr, nullptr ) );
    EXPECT_NO_THROW( SceneCombiner::CopySceneFlat( nullptr, nullptr ) );
}